

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void rd_pick_4partition(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp
                       ,MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PC_TREE *pc_tree,
                       PICK_MODE_CONTEXT **cur_part_ctx,PartitionSearchState *part_search_state,
                       RD_STATS *best_rdc,int *inc_step,PARTITION_TYPE partition_type)

{
  RD_STATS best_rdcost;
  uint uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 unaff_RBX;
  PICK_MODE_CONTEXT *unaff_RBP;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 unaff_R12;
  RD_STATS *unaff_R14;
  undefined8 unaff_R15;
  char *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  void *in_stack_00000020;
  int *in_stack_00000028;
  char in_stack_00000030;
  PART4_TYPES i;
  int mi_pos [4] [2];
  PART4_TYPES part4_idx;
  int mi_pos_check [2];
  PartitionBlkParams blk_params;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed4;
  PARTITION_TYPE in_stack_fffffffffffffed5;
  BLOCK_SIZE in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  PICK_MODE_CONTEXT **in_stack_fffffffffffffed8;
  ThreadData_conflict *in_stack_fffffffffffffee0;
  AV1_COMP *in_stack_fffffffffffffee8;
  MACROBLOCK *in_stack_fffffffffffffef0;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_stack_fffffffffffffef8;
  MACROBLOCK *in_stack_ffffffffffffff00;
  byte local_b9;
  uint local_b8 [8];
  byte local_95;
  int local_94;
  int mi_row;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  TileDataEnc *in_stack_ffffffffffffff80;
  ThreadData_conflict *in_stack_ffffffffffffff88;
  AV1_COMP *in_stack_ffffffffffffff90;
  byte local_64;
  long lVar3;
  
  lVar3 = in_RDI;
  memcpy(&stack0xffffffffffffff74,(void *)(in_stack_00000018 + 8),0x2c);
  local_94 = *(int *)(in_RDI + 0x3c194);
  mi_row = *(int *)(in_RDI + 0x3c198);
  local_95 = in_stack_00000030 != '\b';
  get_partition_subsize(in_stack_fffffffffffffed6,in_stack_fffffffffffffed5);
  uVar1 = (uint)local_64;
  set_4_part_ctx_and_rdcost
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,
             (PartitionSearchState *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,
                               CONCAT15(in_stack_fffffffffffffed5,
                                        CONCAT14(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                                                )))),
             (PARTITION_TYPE)((uint)in_stack_fffffffffffffecc >> 0x18),
             (BLOCK_SIZE)in_stack_ffffffffffffff00);
  set_mi_pos_partition4
            (in_stack_00000028,(int (*) [2])local_b8,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff7c);
  local_b9 = 0;
  while( true ) {
    if ((3 < local_b9) ||
       ((local_b9 != 0 &&
        ((&local_94)[local_95] <= (int)local_b8[(ulong)local_b9 * 2 + (ulong)local_95]))))
    goto LAB_00281b99;
    *(undefined4 *)(*(long *)(in_stack_00000010 + (ulong)local_b9 * 8) + 0x1d0) = 0;
    uVar1 = local_b8[(ulong)local_b9 * 2 + 1];
    in_stack_ffffffffffffff00 = (MACROBLOCK *)(in_stack_00000018 + 0x80);
    in_stack_fffffffffffffef8 = *(RD_SEARCH_MACROBLOCK_CONTEXT **)((long)in_stack_00000020 + 0x20);
    in_stack_fffffffffffffee8 = *(AV1_COMP **)((long)in_stack_00000020 + 0x10);
    in_stack_fffffffffffffef0 = *(MACROBLOCK **)((long)in_stack_00000020 + 0x18);
    best_rdcost.dist = in_RSI;
    best_rdcost.rate = (int)in_RDX;
    best_rdcost.zero_rate = (int)((ulong)in_RDX >> 0x20);
    best_rdcost.rdcost = lVar3;
    best_rdcost.sse = unaff_RBX;
    best_rdcost._32_8_ = unaff_R12;
    iVar2 = rd_try_subblock(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            in_stack_ffffffffffffff80,
                            (TokenExtra **)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff74,mi_row,(int)in_R8,(BLOCK_SIZE)in_RCX,
                            best_rdcost,unaff_R14,(PARTITION_TYPE)unaff_R15,unaff_RBP);
    if (iVar2 == 0) break;
    local_b9 = local_b9 + 1;
  }
  av1_invalid_rd_stats((RD_STATS *)(in_stack_00000018 + 0x80));
LAB_00281b99:
  av1_rd_cost_update(CONCAT13(in_stack_fffffffffffffed7,
                              CONCAT12(in_stack_fffffffffffffed6,
                                       CONCAT11(in_stack_fffffffffffffed5,in_stack_fffffffffffffed4)
                                      )),(RD_STATS *)CONCAT44(in_stack_fffffffffffffecc,uVar1));
  if (*(long *)(in_stack_00000018 + 0x90) < *(long *)((long)in_stack_00000020 + 0x10)) {
    memcpy(in_stack_00000020,(void *)(in_stack_00000018 + 0x80),0x28);
    *(undefined1 *)(in_stack_00000018 + 0x144) = 1;
    *in_stack_00000008 = in_stack_00000030;
  }
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  av1_restore_context(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                      (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0
                      ,(BLOCK_SIZE)((ulong)in_stack_fffffffffffffee8 >> 0x38),
                      (int)in_stack_fffffffffffffee8);
  return;
}

Assistant:

static void rd_pick_4partition(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PC_TREE *pc_tree, PICK_MODE_CONTEXT *cur_part_ctx[SUB_PARTITIONS_PART4],
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    const int inc_step[NUM_PART4_TYPES], PARTITION_TYPE partition_type) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  // mi positions needed for HORZ4 and VERT4 partition types.
  int mi_pos_check[NUM_PART4_TYPES] = { cm->mi_params.mi_rows,
                                        cm->mi_params.mi_cols };
  const PART4_TYPES part4_idx = (partition_type != PARTITION_HORZ_4);
  int mi_pos[SUB_PARTITIONS_PART4][2];

  blk_params.subsize = get_partition_subsize(blk_params.bsize, partition_type);
  // Set partition context and RD cost.
  set_4_part_ctx_and_rdcost(x, cpi, td, cur_part_ctx, part_search_state,
                            partition_type, blk_params.bsize);
  // Set mi positions for sub-block sizes.
  set_mi_pos_partition4(inc_step, mi_pos, blk_params.mi_row, blk_params.mi_col);
#if CONFIG_COLLECT_PARTITION_STATS
  PartitionTimingStats *part_timing_stats =
      &part_search_state->part_timing_stats;
  if (best_rdc->rdcost - part_search_state->sum_rdc.rdcost >= 0) {
    start_partition_block_timer(part_timing_stats, partition_type);
  }
#endif
  // Loop over sub-block partitions.
  for (PART4_TYPES i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    if (i > 0 && mi_pos[i][part4_idx] >= mi_pos_check[part4_idx]) break;

    // Sub-block evaluation of Horz4 / Vert4 partition type.
    cur_part_ctx[i]->rd_mode_is_ready = 0;
    if (!rd_try_subblock(
            cpi, td, tile_data, tp, (i == SUB_PARTITIONS_PART4 - 1),
            mi_pos[i][0], mi_pos[i][1], blk_params.subsize, *best_rdc,
            &part_search_state->sum_rdc, partition_type, cur_part_ctx[i])) {
      av1_invalid_rd_stats(&part_search_state->sum_rdc);
      break;
    }
  }

  // Calculate the total cost and update the best partition.
  av1_rd_cost_update(x->rdmult, &part_search_state->sum_rdc);
  if (part_search_state->sum_rdc.rdcost < best_rdc->rdcost) {
    *best_rdc = part_search_state->sum_rdc;
    part_search_state->found_best_partition = true;
    pc_tree->partitioning = partition_type;
  }
#if CONFIG_COLLECT_PARTITION_STATS
  if (part_timing_stats->timer_is_on) {
    end_partition_block_timer(part_timing_stats, partition_type,
                              part_search_state->sum_rdc.rdcost);
  }
#endif
  av1_restore_context(x, x_ctx, blk_params.mi_row, blk_params.mi_col,
                      blk_params.bsize, av1_num_planes(cm));
}